

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

void deserialize_duplicate_array(void)

{
  char data [13];
  
  data[8] = '\0';
  data[9] = '\x01';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0] = ';';
  data[1] = '0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\x01';
  invalid_deserialize_test(data,0xd,"duplicate array values");
  return;
}

Assistant:

DEFINE_TEST(deserialize_duplicate_array) {
    // clang-format off
    const char data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        0, 0,       // Upper 16 bits of the first container
        1, 0,       // Cardinality - 1 of the first container
        1, 0,       // first value of first container
        0, 0,       // second value of first container (LESS THAN FIRST)
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "duplicate array values");
}